

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::StringPutcMethod::StringPutcMethod(StringPutcMethod *this,Builtins *builtins)

{
  initializer_list<const_slang::ast::Type_*> __l;
  allocator_type local_49;
  _Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_48;
  Type *local_30;
  PredefinedIntegerType *local_28;
  
  local_30 = (Type *)&builtins->intType;
  local_28 = &builtins->byteType;
  __l._M_len = 2;
  __l._M_array = &local_30;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_48,__l,&local_49);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,Putc,Function,2,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_48,&(builtins->voidType).super_Type,true,true);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_48);
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_0058c468;
  return;
}

Assistant:

explicit StringPutcMethod(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::Putc, SubroutineKind::Function, 2,
                               {&builtins.intType, &builtins.byteType}, builtins.voidType, true,
                               /* isFirstArgLValue */ true) {}